

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void __thiscall capnp::_::StructBuilder::clearAll(StructBuilder *this)

{
  bool bVar1;
  unsigned_short *puVar2;
  Iterator local_20;
  Iterator local_1e;
  Range<unsigned_short> RStack_1c;
  unsigned_short i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_short> *__range2;
  StructBuilder *this_local;
  
  if (this->dataSize == 1) {
    setDataField<bool>(this,1,false);
  }
  else {
    WireHelpers::zeroMemory((byte *)this->data,this->dataSize >> 3);
  }
  RStack_1c = kj::zeroTo<unsigned_short>(this->pointerCount);
  ___end2 = &stack0xffffffffffffffe4;
  local_1e = kj::Range<unsigned_short>::begin(___end2);
  local_20 = kj::Range<unsigned_short>::end(___end2);
  while( true ) {
    bVar1 = kj::Range<unsigned_short>::Iterator::operator!=(&local_1e,&local_20);
    if (!bVar1) break;
    puVar2 = kj::Range<unsigned_short>::Iterator::operator*(&local_1e);
    WireHelpers::zeroObject(this->segment,this->capTable,this->pointers + (int)(uint)*puVar2);
    kj::Range<unsigned_short>::Iterator::operator++(&local_1e);
  }
  WireHelpers::zeroMemory(this->pointers,(uint)this->pointerCount);
  return;
}

Assistant:

void StructBuilder::clearAll() {
  if (dataSize == ONE * BITS) {
    setDataField<bool>(ONE * ELEMENTS, false);
  } else {
    WireHelpers::zeroMemory(reinterpret_cast<byte*>(data), dataSize / BITS_PER_BYTE);
  }

  for (auto i: kj::zeroTo(pointerCount)) {
    WireHelpers::zeroObject(segment, capTable, pointers + i);
  }
  WireHelpers::zeroMemory(pointers, pointerCount);
}